

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getTertiaryAfter
          (CollationRootElements *this,int32_t index,uint32_t s,uint32_t t)

{
  uint uVar1;
  uint32_t local_2c;
  uint32_t st;
  uint32_t terLimit;
  uint32_t secTer;
  uint32_t t_local;
  uint32_t s_local;
  int32_t index_local;
  CollationRootElements *this_local;
  
  if (index == 0) {
    if (s == 0) {
      t_local = *this->elements;
      local_2c = 0x4000;
    }
    else {
      t_local = this->elements[1];
      local_2c = getTertiaryBoundary(this);
    }
    st = this->elements[(int)t_local] & 0xffffff7f;
  }
  else {
    st = getFirstSecTerForPrimary(this,index + 1);
    local_2c = getTertiaryBoundary(this);
    t_local = index;
  }
  while( true ) {
    if ((s << 0x10 | t) < st) {
      return st & 0xffff;
    }
    t_local = t_local + 1;
    uVar1 = this->elements[(int)t_local];
    if (((uVar1 & 0x80) == 0) || (s < uVar1 >> 0x10)) break;
    st = uVar1 & 0xffffff7f;
  }
  return local_2c;
}

Assistant:

uint32_t
CollationRootElements::getTertiaryAfter(int32_t index, uint32_t s, uint32_t t) const {
    uint32_t secTer;
    uint32_t terLimit;
    if(index == 0) {
        // primary = 0
        if(s == 0) {
            U_ASSERT(t != 0);
            index = (int32_t)elements[IX_FIRST_TERTIARY_INDEX];
            // Gap at the end of the tertiary CE range.
            terLimit = 0x4000;
        } else {
            index = (int32_t)elements[IX_FIRST_SECONDARY_INDEX];
            // Gap for tertiaries of primary/secondary CEs.
            terLimit = getTertiaryBoundary();
        }
        secTer = elements[index] & ~SEC_TER_DELTA_FLAG;
    } else {
        U_ASSERT(index >= (int32_t)elements[IX_FIRST_PRIMARY_INDEX]);
        secTer = getFirstSecTerForPrimary(index + 1);
        // If this is an explicit sec/ter unit, then it will be read once more.
        terLimit = getTertiaryBoundary();
    }
    uint32_t st = (s << 16) | t;
    for(;;) {
        if(secTer > st) {
            U_ASSERT((secTer >> 16) == s);
            return secTer & 0xffff;
        }
        secTer = elements[++index];
        // No tertiary greater than t for this primary+secondary.
        if((secTer & SEC_TER_DELTA_FLAG) == 0 || (secTer >> 16) > s) { return terLimit; }
        secTer &= ~SEC_TER_DELTA_FLAG;
    }
}